

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::GeometryShaderRenderTest::~GeometryShaderRenderTest
          (GeometryShaderRenderTest *this)

{
  pointer puVar1;
  pointer pVVar2;
  
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GeometryShaderRenderTest_0219aa88;
  deinit(this);
  puVar1 = (this->m_indices).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->m_indices).
                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  pVVar2 = (this->m_vertexAttrData).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pVVar2 != (pointer)0x0) {
    operator_delete(pVVar2,(long)(this->m_vertexAttrData).
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pVVar2);
  }
  pVVar2 = (this->m_vertexPosData).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pVVar2 != (pointer)0x0) {
    operator_delete(pVVar2,(long)(this->m_vertexPosData).
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pVVar2);
  }
  tcu::TestCase::~TestCase((TestCase *)this);
  return;
}

Assistant:

GeometryShaderRenderTest::~GeometryShaderRenderTest (void)
{
	deinit();
}